

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O2

void __thiscall
duckdb::HashJoinLocalSinkState::~HashJoinLocalSinkState(HashJoinLocalSinkState *this)

{
  (this->super_LocalSinkState)._vptr_LocalSinkState =
       (_func_int **)&PTR__HashJoinLocalSinkState_027bb8b8;
  ::std::
  unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>_>::
  ~unique_ptr(&(this->local_filter_state).
               super_unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>_>
             );
  ::std::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>::~unique_ptr
            (&(this->hash_table).
              super_unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>);
  DataChunk::~DataChunk(&this->payload_chunk);
  DataChunk::~DataChunk(&this->join_keys);
  ExpressionExecutor::~ExpressionExecutor(&this->join_key_executor);
  PartitionedTupleDataAppendState::~PartitionedTupleDataAppendState(&this->append_state);
  LocalSinkState::~LocalSinkState(&this->super_LocalSinkState);
  return;
}

Assistant:

HashJoinLocalSinkState(const PhysicalHashJoin &op, ClientContext &context, HashJoinGlobalSinkState &gstate)
	    : join_key_executor(context) {
		auto &allocator = BufferAllocator::Get(context);

		for (auto &cond : op.conditions) {
			join_key_executor.AddExpression(*cond.right);
		}
		join_keys.Initialize(allocator, op.condition_types);

		if (!op.payload_columns.col_types.empty()) {
			payload_chunk.Initialize(allocator, op.payload_columns.col_types);
		}

		hash_table = op.InitializeHashTable(context);
		hash_table->GetSinkCollection().InitializeAppendState(append_state);

		gstate.active_local_states++;

		if (op.filter_pushdown) {
			local_filter_state = op.filter_pushdown->GetLocalState(*gstate.global_filter_state);
		}
	}